

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringExtraTest_ExtraRequestedInlineSpace_Test::
~MicroStringExtraTest_ExtraRequestedInlineSpace_Test
          (MicroStringExtraTest_ExtraRequestedInlineSpace_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(MicroStringExtraTest, ExtraRequestedInlineSpace) {
  // We write in terms of steps to support 64 and 32 bits.
  static constexpr size_t kStep = alignof(MicroString);
  TestExtraCapacity<0 * kStep + 0>(1 * kStep);
  TestExtraCapacity<0 * kStep + 1>(1 * kStep);
  TestExtraCapacity<1 * kStep - 1>(1 * kStep);
  TestExtraCapacity<1 * kStep + 0>(2 * kStep);
  TestExtraCapacity<2 * kStep - 1>(2 * kStep);
  TestExtraCapacity<2 * kStep + 0>(3 * kStep);
  TestExtraCapacity<3 * kStep - 1>(3 * kStep);
  TestExtraCapacity<3 * kStep + 0>(4 * kStep);
}